

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

void __thiscall xe::TestResultParser::handleElementStart(TestResultParser *this)

{
  TestCaseResult *pTVar1;
  List *this_00;
  pointer ppIVar2;
  bool bVar3;
  deBool dVar4;
  TestLogVersion TVar5;
  TestCaseType TVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  EglConfig *item;
  long *plVar10;
  runtime_error *prVar11;
  Type TVar12;
  long *plVar13;
  Item *pIVar14;
  bool bVar15;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar8 = (this->m_xmlParser).m_elementName._M_dataplus._M_p;
  if (this->m_state == STATE_INITIALIZED) {
    dVar4 = deStringEqual(pcVar8,"TestCaseResult");
    if (dVar4 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Expected <TestCaseResult>, got <","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_70);
      local_50 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_50 == plVar13) {
        local_40 = *plVar13;
        lStack_38 = plVar10[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar13;
      }
      local_48 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_90 == plVar13) {
        local_80 = *plVar13;
        lStack_78 = plVar10[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar13;
      }
      local_88 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar8 = getAttribute(this,"Version");
    TVar5 = getEnumValue("test log version",(EnumMapEntry *)s_logVersionMap,6,pcVar8);
    this->m_logVersion = TVar5;
    pcVar9 = getAttribute(this,"CasePath");
    pTVar1 = this->m_result;
    pcVar8 = (char *)(pTVar1->super_TestCaseResultHeader).casePath._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)pTVar1,0,pcVar8,(ulong)pcVar9);
    (this->m_result->super_TestCaseResultHeader).caseType = TESTCASETYPE_SELF_VALIDATE;
    bVar3 = xml::Parser::hasAttribute(&this->m_xmlParser,"CaseType");
    if (bVar3) {
      pcVar8 = xml::Parser::getAttribute(&this->m_xmlParser,"CaseType");
      TVar6 = getEnumValue("test case type",(EnumMapEntry *)s_testTypeMap,4,pcVar8);
    }
    else {
      if (2 < (int)this->m_logVersion) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Missing CaseType attribute in <TestCaseResult>","");
        std::runtime_error::runtime_error(prVar11,(string *)&local_90);
        *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
        __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar8 = (this->m_result->super_TestCaseResultHeader).casePath._M_dataplus._M_p;
      dVar4 = deStringBeginsWith(pcVar8,"dEQP-GLES2.");
      if (dVar4 == 0) {
        TVar6 = TESTCASETYPE_SELF_VALIDATE;
      }
      else {
        pcVar8 = pcVar8 + 0xb;
        dVar4 = deStringBeginsWith(pcVar8,"capability.");
        TVar6 = TESTCASETYPE_CAPABILITY;
        if (dVar4 == 0) {
          dVar4 = deStringBeginsWith(pcVar8,"accuracy.");
          TVar6 = TESTCASETYPE_ACCURACY;
          if (dVar4 == 0) {
            dVar4 = deStringBeginsWith(pcVar8,"performance.");
            TVar6 = (uint)(dVar4 != 0) * 3;
          }
        }
      }
    }
    (this->m_result->super_TestCaseResultHeader).caseType = TVar6;
    this->m_state = STATE_IN_TEST_CASE_RESULT;
    return;
  }
  this_00 = this->m_curItemList;
  iVar7 = getEnumValue("result item type",(EnumMapEntry *)s_resultItemMap,0x19,pcVar8);
  ppIVar2 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  TVar12 = TYPE_LAST;
  if (((this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
       _M_impl.super__Vector_impl_data._M_start == ppIVar2) ||
     (pIVar14 = ppIVar2[-1], pIVar14 == (Item *)0x0)) {
    pIVar14 = (Item *)0x0;
  }
  else {
    TVar12 = pIVar14->m_type;
  }
  switch(iVar7) {
  case 0:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Result>(this_00);
    pcVar8 = getAttribute(this,"StatusCode");
    iVar7 = getEnumValue("status code",(EnumMapEntry *)s_statusCodeMap,0xe,pcVar8);
    *(int *)&(item->super_Item).field_0xc = iVar7;
    break;
  case 1:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Text>(this_00);
    break;
  case 2:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Number>(this_00);
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"Description");
    pcVar8 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"Unit");
    pcVar8 = (char *)(item->configCaveat)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->configCaveat,0,pcVar8,(ulong)pcVar9);
    bVar3 = xml::Parser::hasAttribute(&this->m_xmlParser,"Tag");
    if (bVar3) {
      pcVar8 = xml::Parser::getAttribute(&this->m_xmlParser,"Tag");
      std::__cxx11::string::operator=((string *)&item->configID,pcVar8);
    }
    (this->m_curNumValue)._M_string_length = 0;
    *(this->m_curNumValue)._M_dataplus._M_p = '\0';
    break;
  case 3:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Image>(this_00);
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"Description");
    pcVar8 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"Width");
    iVar7 = atoi(pcVar8);
    *(int *)&(item->configCaveat)._M_dataplus._M_p = iVar7;
    pcVar8 = getAttribute(this,"Height");
    iVar7 = atoi(pcVar8);
    *(int *)((long)&(item->configCaveat)._M_dataplus._M_p + 4) = iVar7;
    pcVar8 = getAttribute(this,"Format");
    iVar7 = getEnumValue("image format",(EnumMapEntry *)s_imageFormatMap,2,pcVar8);
    *(int *)&(((InfoLog *)&(item->configCaveat)._M_string_length)->super_Item)._vptr_Item = iVar7;
    pcVar8 = getAttribute(this,"CompressionMode");
    iVar7 = getEnumValue("image compression",(EnumMapEntry *)s_compressionMap,2,pcVar8);
    *(int *)((long)&(((InfoLog *)&(item->configCaveat)._M_string_length)->super_Item)._vptr_Item + 4
            ) = iVar7;
    break;
  case 4:
    item = (EglConfig *)ri::List::allocItem<xe::ri::ImageSet>(this_00);
    goto LAB_0010e9e1;
  case 5:
    if (TVar12 != TYPE_SHADERPROGRAM) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"<","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_70);
      local_50 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_50 == plVar13) {
        local_40 = *plVar13;
        lStack_38 = plVar10[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar13;
      }
      local_48 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_90 == plVar13) {
        local_80 = *plVar13;
        lStack_78 = plVar10[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar13;
      }
      local_88 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::Shader>(this_00);
    iVar7 = getEnumValue("shader type",(EnumMapEntry *)s_shaderTypeFromTagMap,6,pcVar8);
    *(int *)&(item->super_Item).field_0xc = iVar7;
    pcVar8 = getAttribute(this,"CompileStatus");
    dVar4 = deStringEqual(pcVar8,"OK");
    bVar3 = true;
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar3 = dVar4 != 0;
    }
    *(bool *)&(((string *)&item->redSize)->_M_dataplus)._M_p = bVar3;
    break;
  case 6:
    item = (EglConfig *)ri::List::allocItem<xe::ri::ShaderProgram>(this_00);
    pcVar8 = getAttribute(this,"LinkStatus");
    dVar4 = deStringEqual(pcVar8,"OK");
    bVar3 = true;
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar3 = dVar4 != 0;
    }
    item->bindToTextureRGB = bVar3;
    break;
  case 7:
    if (TVar12 != TYPE_SHADER) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unexpected <ShaderSource>","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)&pIVar14[1].m_type;
    break;
  case 8:
    if (TVar12 != TYPE_SHADERPROGRAM) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"<","");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_70);
      local_50 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_50 == plVar13) {
        local_40 = *plVar13;
        lStack_38 = plVar10[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar13;
      }
      local_48 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar10;
      plVar13 = plVar10 + 2;
      if (local_90 == plVar13) {
        local_80 = *plVar13;
        lStack_78 = plVar10[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar13;
      }
      local_88 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::SpirVSource>(this_00);
    break;
  case 9:
    if (TVar12 == TYPE_SHADER) {
      item = (EglConfig *)&pIVar14[4].m_type;
    }
    else if (TVar12 == TYPE_COMPILEINFO) {
      item = (EglConfig *)&pIVar14[5].m_type;
    }
    else {
      if (TVar12 != TYPE_SHADERPROGRAM) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_90 = &local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Unexpected <InfoLog>","");
        std::runtime_error::runtime_error(prVar11,(string *)&local_90);
        *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
        __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
      }
      item = (EglConfig *)(pIVar14 + 3);
    }
    break;
  case 10:
    item = ri::List::allocItem<xe::ri::EglConfig>(this_00);
    pcVar8 = getAttribute(this,"BufferSize");
    iVar7 = atoi(pcVar8);
    *(int *)&(item->super_Item).field_0xc = iVar7;
    pcVar8 = getAttribute(this,"RedSize");
    iVar7 = atoi(pcVar8);
    item->redSize = iVar7;
    pcVar8 = getAttribute(this,"GreenSize");
    iVar7 = atoi(pcVar8);
    item->greenSize = iVar7;
    pcVar8 = getAttribute(this,"BlueSize");
    iVar7 = atoi(pcVar8);
    item->blueSize = iVar7;
    pcVar8 = getAttribute(this,"LuminanceSize");
    iVar7 = atoi(pcVar8);
    item->luminanceSize = iVar7;
    pcVar8 = getAttribute(this,"AlphaSize");
    iVar7 = atoi(pcVar8);
    item->alphaSize = iVar7;
    pcVar8 = getAttribute(this,"AlphaMaskSize");
    iVar7 = atoi(pcVar8);
    item->alphaMaskSize = iVar7;
    pcVar8 = getAttribute(this,"BindToTextureRGB");
    dVar4 = deStringEqual(pcVar8,"OK");
    bVar15 = true;
    bVar3 = true;
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar3 = dVar4 != 0;
    }
    item->bindToTextureRGB = bVar3;
    pcVar8 = getAttribute(this,"BindToTextureRGBA");
    dVar4 = deStringEqual(pcVar8,"OK");
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar15 = dVar4 != 0;
    }
    item->bindToTextureRGBA = bVar15;
    pcVar9 = getAttribute(this,"ColorBufferType");
    pcVar8 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"ConfigCaveat");
    pcVar8 = (char *)(item->configCaveat)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->configCaveat,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"ConfigID");
    iVar7 = atoi(pcVar8);
    item->configID = iVar7;
    pcVar9 = getAttribute(this,"Conformant");
    pcVar8 = (char *)(item->conformant)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->conformant,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"DepthSize");
    iVar7 = atoi(pcVar8);
    item->depthSize = iVar7;
    pcVar8 = getAttribute(this,"Level");
    iVar7 = atoi(pcVar8);
    item->level = iVar7;
    pcVar8 = getAttribute(this,"MaxPBufferWidth");
    iVar7 = atoi(pcVar8);
    item->maxPBufferWidth = iVar7;
    pcVar8 = getAttribute(this,"MaxPBufferHeight");
    iVar7 = atoi(pcVar8);
    item->maxPBufferHeight = iVar7;
    pcVar8 = getAttribute(this,"MaxPBufferPixels");
    iVar7 = atoi(pcVar8);
    item->maxPBufferPixels = iVar7;
    pcVar8 = getAttribute(this,"MaxSwapInterval");
    iVar7 = atoi(pcVar8);
    item->maxSwapInterval = iVar7;
    pcVar8 = getAttribute(this,"MinSwapInterval");
    iVar7 = atoi(pcVar8);
    item->minSwapInterval = iVar7;
    pcVar8 = getAttribute(this,"NativeRenderable");
    dVar4 = deStringEqual(pcVar8,"OK");
    bVar3 = true;
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar3 = dVar4 != 0;
    }
    item->nativeRenderable = bVar3;
    pcVar9 = getAttribute(this,"RenderableType");
    pcVar8 = (char *)(item->renderableType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->renderableType,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"SampleBuffers");
    iVar7 = atoi(pcVar8);
    item->sampleBuffers = iVar7;
    pcVar8 = getAttribute(this,"Samples");
    iVar7 = atoi(pcVar8);
    item->samples = iVar7;
    pcVar8 = getAttribute(this,"StencilSize");
    iVar7 = atoi(pcVar8);
    item->stencilSize = iVar7;
    pcVar9 = getAttribute(this,"SurfaceTypes");
    pcVar8 = (char *)(item->surfaceTypes)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->surfaceTypes,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"TransparentType");
    pcVar8 = (char *)(item->transparentType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->transparentType,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"TransparentRedValue");
    iVar7 = atoi(pcVar8);
    item->transparentRedValue = iVar7;
    pcVar8 = getAttribute(this,"TransparentGreenValue");
    iVar7 = atoi(pcVar8);
    item->transparentGreenValue = iVar7;
    pcVar8 = getAttribute(this,"TransparentBlueValue");
    iVar7 = atoi(pcVar8);
    item->transparentBlueValue = iVar7;
    break;
  case 0xb:
    item = (EglConfig *)ri::List::allocItem<xe::ri::EglConfigSet>(this_00);
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    bVar3 = xml::Parser::hasAttribute(&this->m_xmlParser,"Description");
    if (bVar3) {
      pcVar8 = xml::Parser::getAttribute(&this->m_xmlParser,"Description");
    }
    else {
      pcVar8 = "";
    }
    pcVar9 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar8);
    goto LAB_0010f21f;
  case 0xc:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Section>(this_00);
    goto LAB_0010e9e1;
  case 0xd:
    item = (EglConfig *)ri::List::allocItem<xe::ri::KernelSource>(this_00);
    break;
  case 0xe:
    item = (EglConfig *)ri::List::allocItem<xe::ri::CompileInfo>(this_00);
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"Description");
    pcVar8 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"CompileStatus");
    dVar4 = deStringEqual(pcVar8,"OK");
    bVar3 = true;
    if (dVar4 == 0) {
      dVar4 = deStringEqual(pcVar8,"True");
      bVar3 = dVar4 != 0;
    }
    *(bool *)&(item->configCaveat)._M_dataplus._M_p = bVar3;
    break;
  case 0xf:
    item = (EglConfig *)ri::List::allocItem<xe::ri::SampleList>(this_00);
LAB_0010e9e1:
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"Description");
    pcVar9 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar8);
LAB_0010f21f:
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar9,(ulong)pcVar8);
    break;
  case 0x10:
    if (TVar12 != TYPE_SAMPLELIST) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"<SampleInfo> outside of <SampleList>","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)(pIVar14 + 5);
    break;
  case 0x11:
    if (TVar12 != TYPE_SAMPLEINFO) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"<ValueInfo> outside of <SampleInfo>","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::ValueInfo>((List *)(pIVar14 + 1));
    pcVar9 = getAttribute(this,"Name");
    pcVar8 = *(char **)&item->blueSize;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->redSize,0,pcVar8,(ulong)pcVar9);
    pcVar9 = getAttribute(this,"Description");
    pcVar8 = (char *)(item->colorBufferType)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&item->colorBufferType,0,pcVar8,(ulong)pcVar9);
    pcVar8 = getAttribute(this,"Tag");
    iVar7 = getEnumValue("sample value tag",(EnumMapEntry *)s_sampleValueTagMap,2,pcVar8);
    *(int *)&(((string *)&item->configID)->_M_dataplus)._M_p = iVar7;
    bVar3 = xml::Parser::hasAttribute(&this->m_xmlParser,"Unit");
    if (bVar3) {
      pcVar8 = getAttribute(this,"Unit");
      std::__cxx11::string::operator=((string *)&item->configCaveat,pcVar8);
    }
    break;
  case 0x12:
    if (TVar12 != TYPE_SAMPLELIST) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"<Sample> outside of <SampleList>","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::Sample>((List *)&pIVar14[7].m_type);
    break;
  case 0x13:
    if (TVar12 != TYPE_SAMPLE) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"<Value> outside of <Sample>","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
      __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::SampleValue>((List *)(pIVar14 + 1));
    break;
  default:
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Unsupported element \'","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_70);
    local_50 = (long *)*plVar10;
    plVar13 = plVar10 + 2;
    if (local_50 == plVar13) {
      local_40 = *plVar13;
      lStack_38 = plVar10[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar13;
    }
    local_48 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar10;
    plVar13 = plVar10 + 2;
    if (local_90 == plVar13) {
      local_80 = *plVar13;
      lStack_78 = plVar10[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar13;
    }
    local_88 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::runtime_error::runtime_error(prVar11,(string *)&local_90);
    *(undefined ***)prVar11 = &PTR__runtime_error_0011e820;
    __cxa_throw(prVar11,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  pushItem(this,&item->super_Item);
  this->m_base64DecodeOffset = 0;
  return;
}

Assistant:

void TestResultParser::handleElementStart (void)
{
	const char* elemName = m_xmlParser.getElementName();

	if (m_state == STATE_INITIALIZED)
	{
		// Expect TestCaseResult.
		if (!deStringEqual(elemName, "TestCaseResult"))
			throw TestResultParseError(string("Expected <TestCaseResult>, got <") + elemName + ">");

		const char* version = getAttribute("Version");
		m_logVersion = getTestLogVersion(version);
		// \note Currently assumed that all known log versions are supported.

		m_result->casePath	= getAttribute("CasePath");
		m_result->caseType	= TESTCASETYPE_SELF_VALIDATE;

		if (m_xmlParser.hasAttribute("CaseType"))
			m_result->caseType = getTestCaseType(m_xmlParser.getAttribute("CaseType"));
		else
		{
			// Do guess based on path for legacy log files.
			if (m_logVersion >= TESTLOGVERSION_0_3_2)
				throw TestResultParseError("Missing CaseType attribute in <TestCaseResult>");
			m_result->caseType = getTestCaseTypeFromPath(m_result->casePath.c_str());
		}

		m_state = STATE_IN_TEST_CASE_RESULT;
	}
	else
	{
		ri::List*	curList		= getCurrentItemList();
		ri::Type	itemType	= getResultItemType(elemName);
		ri::Item*	item		= DE_NULL;
		ri::Item*	parentItem	= getCurrentItem();
		ri::Type	parentType	= parentItem ? parentItem->getType() : ri::TYPE_LAST;

		switch (itemType)
		{
			case ri::TYPE_RESULT:
			{
				ri::Result* result = curList->allocItem<ri::Result>();
				result->statusCode = getTestStatusCode(getAttribute("StatusCode"));
				item = result;
				break;
			}

			case ri::TYPE_TEXT:
				item = curList->allocItem<ri::Text>();
				break;

			case ri::TYPE_SECTION:
			{
				ri::Section* section = curList->allocItem<ri::Section>();
				section->name			= getAttribute("Name");
				section->description	= getAttribute("Description");
				item = section;
				break;
			}

			case ri::TYPE_NUMBER:
			{
				ri::Number* number = curList->allocItem<ri::Number>();
				number->name		= getAttribute("Name");
				number->description	= getAttribute("Description");
				number->unit		= getAttribute("Unit");

				if (m_xmlParser.hasAttribute("Tag"))
					number->tag = m_xmlParser.getAttribute("Tag");

				item = number;

				m_curNumValue.clear();
				break;
			}

			case ri::TYPE_IMAGESET:
			{
				ri::ImageSet* imageSet = curList->allocItem<ri::ImageSet>();
				imageSet->name			= getAttribute("Name");
				imageSet->description	= getAttribute("Description");
				item = imageSet;
				break;
			}

			case ri::TYPE_IMAGE:
			{
				ri::Image* image = curList->allocItem<ri::Image>();
				image->name			= getAttribute("Name");
				image->description	= getAttribute("Description");
				image->width		= toInt(getAttribute("Width"));
				image->height		= toInt(getAttribute("Height"));
				image->format		= getImageFormat(getAttribute("Format"));
				image->compression	= getImageCompression(getAttribute("CompressionMode"));
				item = image;
				break;
			}

			case ri::TYPE_SHADERPROGRAM:
			{
				ri::ShaderProgram* shaderProgram = curList->allocItem<ri::ShaderProgram>();
				shaderProgram->linkStatus = toBool(getAttribute("LinkStatus"));
				item = shaderProgram;
				break;
			}

			case ri::TYPE_SHADER:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");

				ri::Shader* shader = curList->allocItem<ri::Shader>();

				shader->shaderType		= getShaderTypeFromTagName(elemName);
				shader->compileStatus	= toBool(getAttribute("CompileStatus"));

				item = shader;
				break;
			}

			case ri::TYPE_SPIRVSOURCE:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");
				item = curList->allocItem<ri::SpirVSource>();
				break;
			}

			case ri::TYPE_SHADERSOURCE:
				if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->source;
				else
					throw TestResultParseError("Unexpected <ShaderSource>");
				break;

			case ri::TYPE_INFOLOG:
				if (parentType == ri::TYPE_SHADERPROGRAM)
					item = &static_cast<ri::ShaderProgram*>(parentItem)->linkInfoLog;
				else if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->infoLog;
				else if (parentType == ri::TYPE_COMPILEINFO)
					item = &static_cast<ri::CompileInfo*>(parentItem)->infoLog;
				else
					throw TestResultParseError("Unexpected <InfoLog>");
				break;

			case ri::TYPE_KERNELSOURCE:
				item = curList->allocItem<ri::KernelSource>();
				break;

			case ri::TYPE_COMPILEINFO:
			{
				ri::CompileInfo* info = curList->allocItem<ri::CompileInfo>();
				info->name			= getAttribute("Name");
				info->description	= getAttribute("Description");
				info->compileStatus	= toBool(getAttribute("CompileStatus"));
				item = info;
				break;
			}

			case ri::TYPE_EGLCONFIGSET:
			{
				ri::EglConfigSet* set = curList->allocItem<ri::EglConfigSet>();
				set->name			= getAttribute("Name");
				set->description	= m_xmlParser.hasAttribute("Description") ? m_xmlParser.getAttribute("Description") : "";
				item = set;
				break;
			}

			case ri::TYPE_EGLCONFIG:
			{
				ri::EglConfig* config = curList->allocItem<ri::EglConfig>();
				config->bufferSize				= toInt(getAttribute("BufferSize"));
				config->redSize					= toInt(getAttribute("RedSize"));
				config->greenSize				= toInt(getAttribute("GreenSize"));
				config->blueSize				= toInt(getAttribute("BlueSize"));
				config->luminanceSize			= toInt(getAttribute("LuminanceSize"));
				config->alphaSize				= toInt(getAttribute("AlphaSize"));
				config->alphaMaskSize			= toInt(getAttribute("AlphaMaskSize"));
				config->bindToTextureRGB		= toBool(getAttribute("BindToTextureRGB"));
				config->bindToTextureRGBA		= toBool(getAttribute("BindToTextureRGBA"));
				config->colorBufferType			= getAttribute("ColorBufferType");
				config->configCaveat			= getAttribute("ConfigCaveat");
				config->configID				= toInt(getAttribute("ConfigID"));
				config->conformant				= getAttribute("Conformant");
				config->depthSize				= toInt(getAttribute("DepthSize"));
				config->level					= toInt(getAttribute("Level"));
				config->maxPBufferWidth			= toInt(getAttribute("MaxPBufferWidth"));
				config->maxPBufferHeight		= toInt(getAttribute("MaxPBufferHeight"));
				config->maxPBufferPixels		= toInt(getAttribute("MaxPBufferPixels"));
				config->maxSwapInterval			= toInt(getAttribute("MaxSwapInterval"));
				config->minSwapInterval			= toInt(getAttribute("MinSwapInterval"));
				config->nativeRenderable		= toBool(getAttribute("NativeRenderable"));
				config->renderableType			= getAttribute("RenderableType");
				config->sampleBuffers			= toInt(getAttribute("SampleBuffers"));
				config->samples					= toInt(getAttribute("Samples"));
				config->stencilSize				= toInt(getAttribute("StencilSize"));
				config->surfaceTypes			= getAttribute("SurfaceTypes");
				config->transparentType			= getAttribute("TransparentType");
				config->transparentRedValue		= toInt(getAttribute("TransparentRedValue"));
				config->transparentGreenValue	= toInt(getAttribute("TransparentGreenValue"));
				config->transparentBlueValue	= toInt(getAttribute("TransparentBlueValue"));
				item = config;
				break;
			}

			case ri::TYPE_SAMPLELIST:
			{
				ri::SampleList* list = curList->allocItem<ri::SampleList>();
				list->name			= getAttribute("Name");
				list->description	= getAttribute("Description");
				item = list;
				break;
			}

			case ri::TYPE_SAMPLEINFO:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<SampleInfo> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::SampleInfo*	info	= &list->sampleInfo;

				item = info;
				break;
			}

			case ri::TYPE_VALUEINFO:
			{
				if (parentType != ri::TYPE_SAMPLEINFO)
					throw TestResultParseError("<ValueInfo> outside of <SampleInfo>");

				ri::SampleInfo*	sampleInfo	= static_cast<ri::SampleInfo*>(parentItem);
				ri::ValueInfo*	valueInfo	= sampleInfo->valueInfos.allocItem<ri::ValueInfo>();

				valueInfo->name			= getAttribute("Name");
				valueInfo->description	= getAttribute("Description");
				valueInfo->tag			= getSampleValueTag(getAttribute("Tag"));

				if (m_xmlParser.hasAttribute("Unit"))
					valueInfo->unit = getAttribute("Unit");

				item = valueInfo;
				break;
			}

			case ri::TYPE_SAMPLE:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<Sample> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::Sample*		sample	= list->samples.allocItem<ri::Sample>();

				item = sample;
				break;
			}

			case ri::TYPE_SAMPLEVALUE:
			{
				if (parentType != ri::TYPE_SAMPLE)
					throw TestResultParseError("<Value> outside of <Sample>");

				ri::Sample*			sample	= static_cast<ri::Sample*>(parentItem);
				ri::SampleValue*	value	= sample->values.allocItem<ri::SampleValue>();

				item = value;
				break;
			}

			default:
				throw TestResultParseError(string("Unsupported element '") + elemName + ("'"));
		}

		DE_ASSERT(item);
		pushItem(item);

		// Reset base64 decoding offset.
		m_base64DecodeOffset = 0;
	}
}